

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O3

void __thiscall Schedule::restoreAndDumpToFile(Schedule *this,string *path)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 extraout_RAX;
  json json;
  ofstream file;
  undefined1 local_248 [16];
  string_t local_238;
  _Base_ptr local_218;
  filebuf local_210 [240];
  ios_base local_120 [264];
  
  Common::restore((this->common).super___shared_ptr<Common,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                  &this->head);
  bVar1 = Common::check((this->common).super___shared_ptr<Common,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        ,&this->head);
  if (bVar1) {
    Common::toJson_abi_cxx11_
              ((Common *)local_248,
               (TaskHandle *)
               (this->common).super___shared_ptr<Common,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::ofstream::ofstream(&local_218,(string *)path,_S_out);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::dump(&local_238,
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            *)local_248,4,' ',false,strict);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_218,local_238._M_dataplus._M_p,local_238._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    local_218 = _VTT;
    *(undefined8 *)((long)&local_218 + (long)_VTT[-1]._M_parent) = _memcpy;
    std::filebuf::~filebuf(local_210);
    std::ios_base::~ios_base(local_120);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_248);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::json_value::destroy((json_value *)(local_248 + 8),local_248[0]);
    return;
  }
  error("Check failed while dumping to file.\n");
  std::ofstream::~ofstream(&local_218);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)local_248);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void restoreAndDumpToFile(const std::string &path) {
        // Restore to the format with attributes, .dealloc and .share
        common->restore(head);
        if (not common->check(head)) {
            error("Check failed while dumping to file.\n");
        }

        // Dump into json
        auto json = common->toJson(head);
        std::ofstream file(path);
        file << json.dump(4) << std::endl;
    }